

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_RecordImplicitCall(InterpreterStackFrame *this,uint loopNumber)

{
  FunctionBody *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  DynamicProfileInfo *this_01;
  
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(*(FunctionBody **)(this + 0x88));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x169d,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar2) goto LAB_00a478ae;
    *puVar4 = 0;
  }
  uVar3 = FunctionBody::GetCountField(*(FunctionBody **)(this + 0x88),LoopCount);
  if (uVar3 <= loopNumber) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x169e,"(loopNumber < this->m_functionBody->GetLoopCount())",
                                "loopNumber < this->m_functionBody->GetLoopCount()");
    if (!bVar2) {
LAB_00a478ae:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  DynamicProfileInfo::RecordLoopImplicitCallFlags
            (this_01,this_00,loopNumber,
             *(ImplicitCallFlags *)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x1570));
  return;
}

Assistant:

void InterpreterStackFrame::OP_RecordImplicitCall(uint loopNumber)
    {
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
        Assert(loopNumber < this->m_functionBody->GetLoopCount());

        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        dynamicProfileInfo->RecordLoopImplicitCallFlags(functionBody, loopNumber, threadContext->GetImplicitCallFlags());
    }